

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::SGDOptimizer::MergePartialFromCodedStream
          (SGDOptimizer *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  uint uVar6;
  DoubleParameter *pDVar7;
  ulong extraout_RAX;
  Int64Parameter *this_00;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  char cVar8;
  ulong uVar9;
  int local_3c;
  int local_38;
  int local_34;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0024242d;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0024242d:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar9 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar4 | uVar9;
    }
    uVar4 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto LAB_0024244e;
    uVar6 = (uint)(uVar9 >> 3) & 0x1fffffff;
    cVar8 = (char)uVar9;
    if (uVar6 == 3) {
      if (cVar8 != '\x1a') goto LAB_0024244e;
      if (this->momentum_ == (DoubleParameter *)0x0) {
        pDVar7 = (DoubleParameter *)operator_new(0x28);
        DoubleParameter::DoubleParameter(pDVar7);
        this->momentum_ = pDVar7;
      }
      MergePartialFromCodedStream();
      iVar5 = local_3c;
      uVar9 = extraout_RAX_01;
joined_r0x002425a3:
      if ((uVar9 & 1) != 0) goto LAB_00242479;
LAB_00242477:
      iVar5 = 0;
    }
    else if (uVar6 == 2) {
      if (cVar8 == '\x12') {
        if (this->minibatchsize_ == (Int64Parameter *)0x0) {
          this_00 = (Int64Parameter *)operator_new(0x28);
          Int64Parameter::Int64Parameter(this_00);
          this->minibatchsize_ = this_00;
        }
        MergePartialFromCodedStream();
        iVar5 = local_38;
        uVar9 = extraout_RAX_00;
        goto joined_r0x002425a3;
      }
LAB_0024244e:
      iVar5 = 7;
      if ((uVar4 & 7) != 4 && uVar4 != 0) {
        bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
        if (bVar3) goto LAB_00242477;
        iVar5 = 6;
      }
    }
    else {
      if ((uVar6 != 1) || (cVar8 != '\n')) goto LAB_0024244e;
      if (this->learningrate_ == (DoubleParameter *)0x0) {
        pDVar7 = (DoubleParameter *)operator_new(0x28);
        DoubleParameter::DoubleParameter(pDVar7);
        this->learningrate_ = pDVar7;
      }
      MergePartialFromCodedStream();
      iVar5 = local_34;
      if ((extraout_RAX & 1) == 0) goto LAB_00242477;
    }
LAB_00242479:
    if (iVar5 != 0) {
      return iVar5 != 6;
    }
  } while( true );
}

Assistant:

bool SGDOptimizer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SGDOptimizer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.DoubleParameter learningRate = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_learningrate()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter miniBatchSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_minibatchsize()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleParameter momentum = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_momentum()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SGDOptimizer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SGDOptimizer)
  return false;
#undef DO_
}